

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTCue_GetState(FACTCue *pCue,uint32_t *pdwState)

{
  if (pCue == (FACTCue *)0x0) {
    *pdwState = 0;
  }
  else {
    FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
    *pdwState = pCue->state;
    FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
  }
  return (uint)(pCue == (FACTCue *)0x0);
}

Assistant:

uint32_t FACTCue_GetState(FACTCue *pCue, uint32_t *pdwState)
{
	if (pCue == NULL)
	{
		*pdwState = 0;
		return 1;
	}
	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
	*pdwState = pCue->state;
	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}